

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int lws_h2_issue_preface(lws *wsi)

{
  lws_h2_netconn *plVar1;
  int iVar2;
  lws_h2_protocol_send *pps;
  int iVar3;
  
  plVar1 = (wsi->h2).h2n;
  iVar2 = lws_issue_raw(wsi,(uchar *)"PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n",0x18);
  iVar3 = 1;
  if (iVar2 == 0x18) {
    lws_role_transition(wsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
    plVar1->count = 0;
    (wsi->txc).tx_cr = 0xffff;
    pps = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
    if (pps != (lws_h2_protocol_send *)0x0) {
      pps->type = LWS_H2_PPS_MY_SETTINGS;
      lws_pps_schedule(wsi,pps);
      _lws_log(8,"%s: h2 client sending settings\n","lws_h2_issue_preface");
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int lws_h2_issue_preface(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;

	if (lws_issue_raw(wsi, (uint8_t *)preface, strlen(preface)) !=
		(int)strlen(preface))
		return 1;

	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_H2_WAITING_TO_SEND_HEADERS,
			    &role_ops_h2);

	h2n->count = 0;
	wsi->txc.tx_cr = 65535;

	/*
	 * we must send a settings frame
	 */
	pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
	if (!pps)
		return 1;
	lws_pps_schedule(wsi, pps);
	lwsl_info("%s: h2 client sending settings\n", __func__);

	return 0;
}